

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# varset.h
# Opt level: O0

void __thiscall
libDAI::VarSet::VarSet(VarSet *this,vector<libDAI::Var,_std::allocator<libDAI::Var>_> *ns)

{
  iterator iVar1;
  __normal_iterator<libDAI::Var_*,_std::vector<libDAI::Var,_std::allocator<libDAI::Var>_>_> this_00;
  vector<libDAI::Var,_std::allocator<libDAI::Var>_> *in_RSI;
  __normal_iterator<libDAI::Var_*,_std::vector<libDAI::Var,_std::allocator<libDAI::Var>_>_> in_RDI;
  iterator new_end;
  vector<libDAI::Var,_std::allocator<libDAI::Var>_> *in_stack_ffffffffffffff48;
  __normal_iterator<const_libDAI::Var_*,_std::vector<libDAI::Var,_std::allocator<libDAI::Var>_>_>
  *in_stack_ffffffffffffff50;
  __normal_iterator<libDAI::Var_*,_std::vector<libDAI::Var,_std::allocator<libDAI::Var>_>_> __first;
  const_iterator in_stack_ffffffffffffff70;
  size_type in_stack_ffffffffffffff78;
  vector<libDAI::Var,_std::allocator<libDAI::Var>_> *in_stack_ffffffffffffff80;
  vector<libDAI::Var,_std::allocator<libDAI::Var>_> *in_stack_ffffffffffffff90;
  __normal_iterator<const_libDAI::Var_*,_std::vector<libDAI::Var,_std::allocator<libDAI::Var>_>_>
  in_stack_ffffffffffffff98;
  __normal_iterator<const_libDAI::Var_*,_std::vector<libDAI::Var,_std::allocator<libDAI::Var>_>_>
  in_stack_ffffffffffffffa0;
  const_iterator in_stack_ffffffffffffffa8;
  
  __first._M_current = in_RDI._M_current;
  std::vector<libDAI::Var,_std::allocator<libDAI::Var>_>::vector
            ((vector<libDAI::Var,_std::allocator<libDAI::Var>_> *)0xb2d481);
  std::vector<libDAI::Var,_std::allocator<libDAI::Var>_>::size(in_RSI);
  std::vector<libDAI::Var,_std::allocator<libDAI::Var>_>::reserve
            (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  std::vector<libDAI::Var,_std::allocator<libDAI::Var>_>::begin(in_stack_ffffffffffffff48);
  __gnu_cxx::
  __normal_iterator<libDAI::Var_const*,std::vector<libDAI::Var,std::allocator<libDAI::Var>>>::
  __normal_iterator<libDAI::Var*>
            (in_stack_ffffffffffffff50,
             (__normal_iterator<libDAI::Var_*,_std::vector<libDAI::Var,_std::allocator<libDAI::Var>_>_>
              *)in_stack_ffffffffffffff48);
  std::vector<libDAI::Var,_std::allocator<libDAI::Var>_>::begin(in_stack_ffffffffffffff48);
  std::vector<libDAI::Var,_std::allocator<libDAI::Var>_>::end(in_stack_ffffffffffffff48);
  iVar1 = std::vector<libDAI::Var,std::allocator<libDAI::Var>>::
          insert<__gnu_cxx::__normal_iterator<libDAI::Var_const*,std::vector<libDAI::Var,std::allocator<libDAI::Var>>>,void>
                    (in_stack_ffffffffffffff90,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,
                     in_stack_ffffffffffffff98);
  std::vector<libDAI::Var,_std::allocator<libDAI::Var>_>::begin(in_stack_ffffffffffffff48);
  std::vector<libDAI::Var,_std::allocator<libDAI::Var>_>::end(in_stack_ffffffffffffff48);
  std::
  sort<__gnu_cxx::__normal_iterator<libDAI::Var*,std::vector<libDAI::Var,std::allocator<libDAI::Var>>>>
            (in_RDI,(__normal_iterator<libDAI::Var_*,_std::vector<libDAI::Var,_std::allocator<libDAI::Var>_>_>
                     )iVar1._M_current);
  std::vector<libDAI::Var,_std::allocator<libDAI::Var>_>::begin(in_stack_ffffffffffffff48);
  std::vector<libDAI::Var,_std::allocator<libDAI::Var>_>::end(in_stack_ffffffffffffff48);
  this_00 = std::
            unique<__gnu_cxx::__normal_iterator<libDAI::Var*,std::vector<libDAI::Var,std::allocator<libDAI::Var>>>>
                      (__first,in_RDI);
  __gnu_cxx::
  __normal_iterator<libDAI::Var_const*,std::vector<libDAI::Var,std::allocator<libDAI::Var>>>::
  __normal_iterator<libDAI::Var*>
            ((__normal_iterator<const_libDAI::Var_*,_std::vector<libDAI::Var,_std::allocator<libDAI::Var>_>_>
              *)this_00._M_current,
             (__normal_iterator<libDAI::Var_*,_std::vector<libDAI::Var,_std::allocator<libDAI::Var>_>_>
              *)in_stack_ffffffffffffff48);
  iVar1 = std::vector<libDAI::Var,_std::allocator<libDAI::Var>_>::end(in_stack_ffffffffffffff48);
  __gnu_cxx::
  __normal_iterator<libDAI::Var_const*,std::vector<libDAI::Var,std::allocator<libDAI::Var>>>::
  __normal_iterator<libDAI::Var*>
            ((__normal_iterator<const_libDAI::Var_*,_std::vector<libDAI::Var,_std::allocator<libDAI::Var>_>_>
              *)this_00._M_current,
             (__normal_iterator<libDAI::Var_*,_std::vector<libDAI::Var,_std::allocator<libDAI::Var>_>_>
              *)in_stack_ffffffffffffff48);
  std::vector<libDAI::Var,_std::allocator<libDAI::Var>_>::erase
            ((vector<libDAI::Var,_std::allocator<libDAI::Var>_> *)__first._M_current,
             (const_iterator)iVar1._M_current,in_stack_ffffffffffffff70);
  calcStateSpace((VarSet *)in_RDI._M_current);
  return;
}

Assistant:

VarSet( const std::vector<Var> &ns ) {
                _vars.reserve( ns.size() );
                _vars.insert( _vars.begin(), ns.begin(), ns.end() );
                std::sort( _vars.begin(), _vars.end() );
                std::vector<Var>::iterator new_end = std::unique( _vars.begin(), _vars.end() );
                _vars.erase( new_end, _vars.end() );
                calcStateSpace();
#ifdef DEBUG
                assert( is_sorted( _vars.begin(), _vars.end() ) );
#endif
            }